

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.cpp
# Opt level: O1

int __thiscall DSDcc::Golay_20_8::init(Golay_20_8 *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  byte bVar4;
  int ip1;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  int syndromeI;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uchar uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 *puVar19;
  uint uVar20;
  undefined1 *puVar21;
  ulong uVar22;
  undefined1 *puVar23;
  uchar uVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  ulong local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  memset(this,0xff,0x3000);
  puVar3 = &m_H;
  local_38 = &DAT_00129672;
  local_40 = &DAT_00129671;
  local_48 = 2;
  uVar16 = 1;
  uVar18 = 0;
  do {
    uVar12 = (uchar)uVar18;
    puVar19 = local_40;
    puVar21 = local_38;
    uVar25 = local_48;
    uVar22 = uVar16;
    if (uVar18 < 7) {
      do {
        uVar24 = (uchar)uVar22;
        puVar23 = puVar21;
        uVar2 = uVar25;
        uVar8 = uVar22;
        while (uVar1 = uVar2, uVar8 < 7) {
          lVar11 = 0;
          bVar4 = 0xb;
          uVar8 = 0;
          do {
            uVar8 = (ulong)((int)uVar8 +
                           (((uint)(byte)puVar23[lVar11] +
                             (uint)(byte)puVar19[lVar11] + (uint)(byte)puVar3[lVar11] & 1) <<
                           (bVar4 & 0x1f)));
            bVar4 = bVar4 - 1;
            lVar11 = lVar11 + 0x14;
          } while (lVar11 != 0xf0);
          this->m_corr[uVar8][0] = uVar12;
          this->m_corr[uVar8][1] = uVar24;
          this->m_corr[uVar8][2] = (uchar)uVar1;
          puVar23 = puVar23 + 1;
          uVar2 = uVar1 + 1;
          uVar8 = uVar1;
        }
        uVar22 = uVar22 + 1;
        lVar11 = 0;
        bVar4 = 0xb;
        uVar8 = 0;
        do {
          uVar9 = (int)uVar8 +
                  (((uint)(byte)puVar19[lVar11] + (uint)(byte)puVar3[lVar11] & 1) << (bVar4 & 0x1f))
          ;
          uVar8 = (ulong)uVar9;
          bVar4 = bVar4 - 1;
          lVar11 = lVar11 + 0x14;
        } while (lVar11 != 0xf0);
        this->m_corr[uVar8][0] = uVar12;
        this->m_corr[uVar8][1] = uVar24;
        uVar5 = 0xb;
        uVar6 = '\b';
        do {
          uVar13 = uVar9 ^ 1 << (uVar5 & 0x1f);
          this->m_corr[uVar13][0] = uVar12;
          this->m_corr[uVar13][1] = uVar24;
          this->m_corr[uVar13][2] = uVar6;
          uVar6 = uVar6 + '\x01';
          bVar27 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar27);
        puVar19 = puVar19 + 1;
        puVar21 = puVar21 + 1;
        uVar25 = uVar25 + 1;
      } while (uVar22 != 8);
    }
    uVar18 = uVar18 + 1;
    uVar22 = 0;
    bVar4 = 0xb;
    lVar11 = -0xf0;
    do {
      uVar9 = (int)uVar22 + ((uint)(byte)puVar3[lVar11 + 0xf0] << (bVar4 & 0x1f));
      uVar22 = (ulong)uVar9;
      bVar4 = bVar4 - 1;
      lVar11 = lVar11 + 0x14;
    } while (lVar11 != 0);
    this->m_corr[uVar22][0] = uVar12;
    uVar5 = 0;
    uVar13 = 10;
    uVar24 = '\t';
    do {
      uVar26 = uVar9 ^ 1 << ((byte)(0xb - (char)uVar5) & 0x1f);
      this->m_corr[uVar26][0] = uVar12;
      uVar7 = (char)uVar5 + '\b';
      this->m_corr[uVar26][1] = uVar7;
      uVar6 = uVar24;
      uVar15 = uVar13;
      if (uVar5 < 0xb) {
        do {
          uVar14 = uVar26 ^ 1 << (uVar15 & 0x1f);
          this->m_corr[(int)uVar14][0] = uVar12;
          this->m_corr[(int)uVar14][1] = uVar7;
          this->m_corr[(int)uVar14][2] = uVar6;
          bVar27 = uVar15 != 0;
          uVar6 = uVar6 + '\x01';
          uVar15 = uVar15 - 1;
        } while (bVar27);
      }
      uVar5 = uVar5 + 1;
      uVar13 = uVar13 - 1;
      uVar24 = uVar24 + '\x01';
    } while (uVar5 != 0xc);
    local_48 = local_48 + 1;
    uVar16 = uVar16 + 1;
    local_38 = local_38 + 1;
    local_40 = local_40 + 1;
    puVar3 = puVar3 + 1;
  } while (uVar18 != 8);
  uVar5 = 9;
  uVar9 = 0;
  do {
    uVar14 = 1 << (0xbU - (char)uVar9 & 0x1f);
    uVar12 = (char)uVar9 + '\b';
    this->m_corr[uVar14][0] = uVar12;
    uVar26 = uVar9 + 1;
    uVar15 = uVar26;
    uVar13 = uVar5;
    if (uVar9 < 0xb) {
      do {
        uVar17 = uVar14 ^ 1 << ((byte)(0xb - (char)uVar15) & 0x1f);
        this->m_corr[(int)uVar17][0] = uVar12;
        uVar24 = (char)uVar15 + '\b';
        this->m_corr[(int)uVar17][1] = uVar24;
        uVar20 = uVar13;
        for (uVar9 = uVar15; uVar9 < 0xb; uVar9 = uVar9 + 1) {
          uVar10 = uVar17 ^ 1 << (uVar20 & 0x1f);
          this->m_corr[(int)uVar10][0] = uVar12;
          this->m_corr[(int)uVar10][1] = uVar24;
          this->m_corr[(int)uVar10][2] = (char)uVar9 + '\t';
          uVar20 = uVar20 - 1;
        }
        uVar15 = uVar15 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar15 != 0xc);
    }
    uVar5 = uVar5 - 1;
    uVar9 = uVar26;
  } while (uVar26 != 0xc);
  return uVar5;
}

Assistant:

void Golay_20_8::init()
{
    memset (m_corr, 0xFF, 3*4096);

    for (int i1 = 0; i1 < 8; i1++)
    {
        for (int i2 = i1+1; i2 < 8; i2++)
        {
            for (int i3 = i2+1; i3 < 8; i3++)
            {
                // 3 bit patterns
                int syndromeI = 0;

                for (int ir = 0; ir < 12; ir++)
                {
                    syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2] +  m_H[20*ir + i3]) % 2) << (11-ir);
                }

                m_corr[syndromeI][0] = i1;
                m_corr[syndromeI][1] = i2;
                m_corr[syndromeI][2] = i3;
            }

            // 2 bit patterns
            int syndromeI = 0;

            for (int ir = 0; ir < 12; ir++)
            {
                syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2]) % 2) << (11-ir);
            }

            m_corr[syndromeI][0] = i1;
            m_corr[syndromeI][1] = i2;

            // 1 possible bit flip left in the parity part
            for (int ip = 0; ip < 12; ip++)
            {
                int syndromeIP = syndromeI ^ (1 << (11-ip));
                m_corr[syndromeIP][0] = i1;
                m_corr[syndromeIP][1] = i2;
                m_corr[syndromeIP][2] = 8 + ip;
            }
        }

        // single bit patterns
        int syndromeI = 0;

        for (int ir = 0; ir < 12; ir++)
        {
            syndromeI += m_H[20*ir + i1] << (11-ir);

        }

        m_corr[syndromeI][0] = i1;

        for (int ip1 = 0; ip1 < 12; ip1++) // 1 more bit flip in parity
        {
            int syndromeIP1 = syndromeI ^ (1 << (11-ip1));
            m_corr[syndromeIP1][0] = i1;
            m_corr[syndromeIP1][1] = 8 + ip1;

            for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
            {
                int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
                m_corr[syndromeIP2][0] = i1;
                m_corr[syndromeIP2][1] = 8 + ip1;
                m_corr[syndromeIP2][2] = 8 + ip2;
            }
        }
    }

    // no bit patterns (in message) -> all in parity
    for (int ip1 = 0; ip1 < 12; ip1++) // 1 bit flip in parity
    {
        int syndromeIP1 =  (1 << (11-ip1));
        m_corr[syndromeIP1][0] = 8 + ip1;

        for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
        {
            int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
            m_corr[syndromeIP2][0] = 8 + ip1;
            m_corr[syndromeIP2][1] = 8 + ip2;

            for (int ip3 = ip2+1; ip3 < 12; ip3++) // 1 more bit flip in parity
            {
                int syndromeIP3 = syndromeIP2 ^ (1 << (11-ip3));
                m_corr[syndromeIP3][0] = 8 + ip1;
                m_corr[syndromeIP3][1] = 8 + ip2;
                m_corr[syndromeIP3][2] = 8 + ip3;
            }
        }
    }
}